

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O3

bool __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::set
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,uint64_t key,uint64_t val)

{
  pointer psVar1;
  pointer psVar2;
  ulong uVar3;
  undefined1 local_58 [16];
  pointer local_48;
  uint64_t local_40;
  uint64_t uStack_38;
  size_p2 sStack_30;
  
  if ((this->table_).
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->table_).
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    standard_hash_table((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)local_58,6);
    psVar1 = (this->table_).
             super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->table_).
             super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->table_).
    super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
    (this->table_).
    super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
    local_58 = ZEXT816(0) << 0x20;
    (this->table_).
    super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
    local_48 = (pointer)0x0;
    if (psVar1 == (pointer)0x0) {
      this->size_ = local_40;
      this->max_size_ = uStack_38;
      (this->capa_size_).bits_ = sStack_30.bits_;
      *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_30._4_4_;
      (this->capa_size_).mask_ = sStack_30.mask_;
    }
    else {
      operator_delete(psVar1,(long)psVar2 - (long)psVar1);
      this->size_ = local_40;
      this->max_size_ = uStack_38;
      (this->capa_size_).bits_ = sStack_30.bits_;
      *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_30._4_4_;
      (this->capa_size_).mask_ = sStack_30.mask_;
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
      }
    }
  }
  if (this->max_size_ <= this->size_) {
    expand_(this);
  }
  uVar3 = (key >> 0x1e ^ key) * -0x40a7b892e31b1a47;
  uVar3 = (uVar3 >> 0x1b ^ uVar3) * -0x6b2fb644ecceee15;
  psVar1 = (this->table_).
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = uVar3 >> 0x1f ^ uVar3;
  while( true ) {
    uVar3 = uVar3 & (this->capa_size_).mask_;
    if (psVar1[uVar3].key == 0xffffffffffffffff) {
      psVar1[uVar3].key = key;
      psVar1[uVar3].val = val;
      this->size_ = this->size_ + 1;
      return true;
    }
    if (psVar1[uVar3].key == key) break;
    uVar3 = uVar3 + 1;
  }
  psVar1[uVar3].val = val;
  return false;
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        if (table_.empty()) {
            *this = this_type(min_capa_bits);
        }

        if (max_size_ <= size_) {
            expand_();
        }

        for (uint64_t i = init_id_(key);; i = right_(i)) {
            if (table_[i].key == UINT64_MAX) {
                table_[i] = {key, val};
                ++size_;
                return true;
            }
            if (table_[i].key == key) {
                table_[i].val = val;
                return false;
            }
        }
    }